

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

LY_ERR lyd_dup(lyd_node *node,ly_ctx *trg_ctx,lyd_node *parent,uint32_t options,ly_bool nosiblings,
              lyd_node **dup_p)

{
  lysc_node *schema2;
  lysc_node *plVar1;
  bool bVar2;
  ly_bool lVar3;
  LY_ERR LVar4;
  lys_module *plVar5;
  uint32_t uVar6;
  lys_module *plVar7;
  uint insert_order;
  lyd_node_inner *node_00;
  lysc_node **pplVar8;
  lyd_node *siblings;
  lyd_node *plVar9;
  undefined7 in_register_00000081;
  lysc_node **pplVar10;
  byte bVar11;
  lyd_node *plVar12;
  lyd_node *plVar13;
  lyd_node *dup;
  lyd_node *iter;
  lyd_node *first_sibling;
  lyd_node *local_80;
  lyd_node *local_70;
  ly_ctx *local_68;
  lyd_node *local_60;
  ly_ctx *local_58;
  lyd_node *local_50;
  uint local_48;
  undefined4 local_44;
  lys_module *local_40;
  lyd_node **local_38;
  
  local_44 = (undefined4)CONCAT71(in_register_00000081,nosiblings);
  local_70 = (lyd_node *)0x0;
  local_50 = (lyd_node *)0x0;
  local_68 = trg_ctx;
  if (trg_ctx == (ly_ctx *)0x0) {
    __assert_fail("node && trg_ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0x8e1,
                  "LY_ERR lyd_dup(const struct lyd_node *, const struct ly_ctx *, struct lyd_node *, uint32_t, ly_bool, struct lyd_node **)"
                 );
  }
  local_38 = dup_p;
  if ((options & 4) == 0) {
    local_80 = (lyd_node *)0x0;
    plVar9 = parent;
  }
  else {
    local_60 = (lyd_node *)0x0;
    node_00 = node->parent;
    local_58 = trg_ctx;
    if (node_00 == (lyd_node_inner *)0x0) {
      bVar2 = true;
      local_80 = (lyd_node *)0x0;
      plVar9 = (lyd_node *)0x0;
    }
    else {
      local_48 = options & 10;
      bVar11 = (byte)node->flags >> 3 & 1;
      local_40 = (lys_module *)&parent[2].schema;
      bVar2 = true;
      local_80 = (lyd_node *)0x0;
      plVar9 = (lyd_node *)0x0;
      do {
        if (bVar11 != 0) {
          if (*(lysc_node **)((long)&node_00->field_0 + 8) == (lysc_node *)0x0) {
            plVar5 = (lys_module *)((long)(node_00 + 1) + 0x30);
          }
          else {
            plVar5 = (*(lysc_node **)((long)&node_00->field_0 + 8))->module;
          }
          local_58 = plVar5->ctx;
        }
        if (parent == (lyd_node *)0x0) {
LAB_0012216e:
          local_60 = (lyd_node *)0x0;
          LVar4 = lyd_dup_r((lyd_node *)node_00,local_58,(lyd_node *)0x0,0,&local_60,local_48,
                            &local_60);
          if (LVar4 != LY_SUCCESS) goto LAB_0012245c;
          if (local_80 != (lyd_node *)0x0) {
            lyd_insert_node(local_60,(lyd_node **)0x0,local_80,0);
          }
          local_80 = local_60;
        }
        else {
          plVar1 = parent->schema;
          plVar5 = local_40;
          if (plVar1 != (lysc_node *)0x0) {
            plVar5 = plVar1->module;
          }
          schema2 = *(lysc_node **)((long)&node_00->field_0 + 8);
          if (schema2 == (lysc_node *)0x0) {
            plVar7 = (lys_module *)((long)(node_00 + 1) + 0x30);
          }
          else {
            plVar7 = schema2->module;
          }
          if ((plVar1 != schema2) || (plVar5->ctx != plVar7->ctx)) {
            plVar5 = local_40;
            if (plVar1 != (lysc_node *)0x0) {
              plVar5 = plVar1->module;
            }
            if (schema2 == (lysc_node *)0x0) {
              plVar7 = (lys_module *)((long)(node_00 + 1) + 0x30);
            }
            else {
              plVar7 = schema2->module;
            }
            if (((plVar5->ctx == plVar7->ctx) ||
                (lVar3 = lyd_compare_schema_equal(plVar1,schema2), lVar3 == '\0')) ||
               (lVar3 = lyd_compare_schema_parents_equal
                                  ((lyd_node *)parent->schema,
                                   (lyd_node *)*(lysc_node **)((long)&node_00->field_0 + 8)),
               lVar3 == '\0')) goto LAB_0012216e;
          }
          bVar2 = false;
          local_60 = parent;
        }
        if (plVar9 == (lyd_node *)0x0) {
          plVar9 = local_60;
        }
        if ((*(uint32_t *)((long)&node_00->field_0 + 4) & 8) != 0) {
          bVar11 = 1;
        }
      } while ((bVar2) &&
              (node_00 = *(lyd_node_inner **)((long)&node_00->field_0 + 0x10),
              node_00 != (lyd_node_inner *)0x0));
    }
    if (!(bool)(bVar2 ^ 1U | parent == (lyd_node *)0x0)) {
      pplVar10 = &node[1].schema;
      if (node->schema != (lysc_node *)0x0) {
        pplVar10 = (lysc_node **)&node->schema->name;
      }
      pplVar8 = &parent[1].schema;
      if (parent->schema != (lysc_node *)0x0) {
        pplVar8 = (lysc_node **)&parent->schema->name;
      }
      LVar4 = LY_EINVAL;
      ly_log(local_58,LY_LLERR,LY_EINVAL,
             "None of the duplicated node \"%s\" schema parents match the provided parent \"%s\".",
             *pplVar10,*pplVar8);
LAB_0012245c:
      plVar9 = local_70;
      if (local_80 != (lyd_node *)0x0) {
LAB_00122466:
        lyd_free_tree(local_80);
        return LVar4;
      }
LAB_00122472:
      lyd_free_siblings(plVar9);
      return LVar4;
    }
    if (local_80 != (lyd_node *)0x0 && parent != (lyd_node *)0x0) {
      lyd_insert_node(parent,(lyd_node **)0x0,local_80,0);
    }
  }
  if (node == (lyd_node *)0x0) {
    plVar12 = (lyd_node *)0x0;
  }
  else {
    insert_order = options >> 5 & 2;
    plVar13 = (lyd_node *)0x0;
    plVar12 = (lyd_node *)0x0;
    do {
      plVar1 = node->schema;
      uVar6 = insert_order;
      if (plVar1 == (lysc_node *)0x0) {
        if (plVar13 != (lyd_node *)0x0) {
LAB_001222e8:
          if (plVar1 == plVar13->schema) {
            uVar6 = 1;
          }
          else {
            plVar13 = (lyd_node *)0x0;
          }
          goto LAB_001222ff;
        }
        LVar4 = lyd_dup_r(node,local_68,plVar9,insert_order,&local_50,options,&local_70);
        if (LVar4 != LY_SUCCESS) goto LAB_00122445;
LAB_00122396:
        plVar13 = (lyd_node *)0x0;
      }
      else if ((plVar1->nodetype == 4) && ((plVar1->flags & 0x100) != 0)) {
        if (plVar9 == (lyd_node *)0x0) {
          if ((options & 4) != 0) {
            __assert_fail("!(options & LYD_DUP_WITH_PARENTS)",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                          ,0x8f1,
                          "LY_ERR lyd_dup(const struct lyd_node *, const struct ly_ctx *, struct lyd_node *, uint32_t, ly_bool, struct lyd_node **)"
                         );
          }
          LVar4 = lyd_dup_r(node,local_68,(lyd_node *)0x0,0,&local_50,options,&local_70);
          if (LVar4 != LY_SUCCESS) goto LAB_00122445;
        }
        else {
          if ((plVar9->schema == (lysc_node *)0x0) || ((plVar9->schema->nodetype & 0x711) != 0)) {
            siblings = *(lyd_node **)(plVar9 + 1);
          }
          else {
            siblings = (lyd_node *)0x0;
          }
          LVar4 = lyd_find_sibling_schema(siblings,plVar1,&local_70);
          if (LVar4 != LY_SUCCESS) {
            ly_log(local_68,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                   ,0x8ef);
            goto LAB_00122445;
          }
        }
      }
      else {
        if (plVar13 != (lyd_node *)0x0) goto LAB_001222e8;
        plVar13 = node;
        if ((plVar1->nodetype & 0x18) == 0) {
          plVar13 = (lyd_node *)0x0;
        }
LAB_001222ff:
        LVar4 = lyd_dup_r(node,local_68,plVar9,uVar6,&local_50,options,&local_70);
        if (LVar4 != LY_SUCCESS) {
LAB_00122445:
          if (local_80 != (lyd_node *)0x0) goto LAB_00122466;
          plVar9 = local_70;
          if (plVar12 != (lyd_node *)0x0) {
            plVar9 = plVar12;
          }
          goto LAB_00122472;
        }
        if (plVar13 == (lyd_node *)0x0) goto LAB_00122396;
        if (local_70->next != (lyd_node *)0x0) {
          plVar13 = (lyd_node *)0x0;
        }
      }
      if (plVar12 == (lyd_node *)0x0) {
        plVar12 = local_70;
      }
    } while (((char)local_44 == '\0') && (node = node->next, node != (lyd_node *)0x0));
  }
  if (local_38 != (lyd_node **)0x0) {
    *local_38 = plVar12;
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyd_dup(const struct lyd_node *node, const struct ly_ctx *trg_ctx, struct lyd_node *parent, uint32_t options,
        ly_bool nosiblings, struct lyd_node **dup_p)
{
    LY_ERR rc;
    const struct lyd_node *orig;            /* original node to be duplicated */
    struct lyd_node *first_dup = NULL;      /* the first duplicated node, this is returned */
    struct lyd_node *top = NULL;            /* the most higher created node */
    struct lyd_node *local_parent = NULL;   /* the direct parent node for the duplicated node(s) */
    struct lyd_node *dup = NULL;            /* duplicate node */
    struct lyd_node *first_sibling = NULL;  /* first sibling node */
    const struct lyd_node *first_llist = NULL;  /* first duplicated (leaf-)list node, if any */
    uint32_t insert_order;

    assert(node && trg_ctx);

    if (options & LYD_DUP_WITH_PARENTS) {
        LY_CHECK_GOTO(rc = lyd_dup_get_local_parent(node, trg_ctx, parent, options & (LYD_DUP_WITH_FLAGS | LYD_DUP_NO_META),
                &top, &local_parent), error);
    } else {
        local_parent = parent;
    }

    LY_LIST_FOR(node, orig) {
        if (lysc_is_key(orig->schema)) {
            if (local_parent) {
                /* the key must already exist in the parent */
                rc = lyd_find_sibling_schema(lyd_child(local_parent), orig->schema, &dup);
                LY_CHECK_ERR_GOTO(rc, LOGINT(trg_ctx), error);
            } else {
                assert(!(options & LYD_DUP_WITH_PARENTS));
                /* duplicating a single key, okay, I suppose... */
                rc = lyd_dup_r(orig, trg_ctx, NULL, LYD_INSERT_NODE_DEFAULT, &first_sibling, options, &dup);
                LY_CHECK_GOTO(rc, error);
            }
        } else {
            /* decide insert order */
            insert_order = (options & LYD_DUP_NO_LYDS) ? LYD_INSERT_NODE_LAST_BY_SCHEMA : LYD_INSERT_NODE_DEFAULT;
            if (first_llist) {
                if (orig->schema != first_llist->schema) {
                    /* all the (leaf-)list instances duplicated */
                    first_llist = NULL;
                } else {
                    /* duplicating all the instances of a (leaf-)list, no need to change their order */
                    insert_order = LYD_INSERT_NODE_LAST;
                }
            } else if (orig->schema && (orig->schema->nodetype & (LYS_LIST | LYS_LEAFLIST))) {
                /* duplicating the first (leaf-)list instance, duplicate the rest more efficiently */
                first_llist = orig;
            }

            /* duplicate the node */
            rc = lyd_dup_r(orig, trg_ctx, local_parent, insert_order, &first_sibling, options, &dup);
            LY_CHECK_GOTO(rc, error);

            if (first_llist && dup->next) {
                /* orig was not the last node (because we are inserting into a parent with some previous instances),
                 * we must check find the order */
                first_llist = NULL;
            }
        }
        first_dup = first_dup ? first_dup : dup;

        if (nosiblings) {
            break;
        }
    }

    if (dup_p) {
        *dup_p = first_dup;
    }
    return LY_SUCCESS;

error:
    if (top) {
        lyd_free_tree(top);
    } else if (first_dup) {
        lyd_free_siblings(first_dup);
    } else {
        lyd_free_siblings(dup);
    }
    return rc;
}